

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O2

string * __thiscall
pbrt::
TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
::ToString_abi_cxx11_
          (string *__return_storage_ptr__,
          TaggedPointer<pbrt::UVMapping2D,pbrt::SphericalMapping2D,pbrt::CylindricalMapping2D,pbrt::PlanarMapping2D>
          *this)

{
  uint *in_R8;
  uint local_14;
  ulong local_10;
  
  local_10 = *(ulong *)this & 0xffffffffffff;
  local_14 = (uint)(ushort)(*(ulong *)this >> 0x30);
  StringPrintf<void_const*,unsigned_int>
            (__return_storage_ptr__,(pbrt *)"[ TaggedPointer ptr: 0x%p tag: %d ]",(char *)&local_10,
             (void **)&local_14,in_R8);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const {
        return StringPrintf("[ TaggedPointer ptr: 0x%p tag: %d ]", ptr(), Tag());
    }